

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uint stbi__zreceive(stbi__zbuf *z,int n)

{
  uint uVar1;
  sbyte sVar2;
  int iVar3;
  
  iVar3 = z->num_bits;
  if (iVar3 < n) {
    stbi__fill_bits(z);
    iVar3 = z->num_bits;
  }
  uVar1 = z->code_buffer;
  sVar2 = ((byte)n < 0x21) * (' ' - (byte)n);
  z->code_buffer = uVar1 >> (n & 0x1fU);
  z->num_bits = iVar3 - n;
  return (uVar1 << sVar2) >> sVar2;
}

Assistant:

stbi_inline static unsigned int stbi__zreceive(stbi__zbuf *z, int n)
{
   unsigned int k;
   if (z->num_bits < n) stbi__fill_bits(z);
   k = z->code_buffer & ((1 << n) - 1);
   z->code_buffer >>= n;
   z->num_bits -= n;
   return k;
}